

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_command_queue queue)

{
  cl_uint refCount;
  
  refCount = 0;
  (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1092,4,&refCount,(size_t *)0x0);
  return refCount;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_command_queue queue ) const
{
    cl_uint refCount = 0;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_REFERENCE_COUNT,
        sizeof(refCount),
        &refCount,
        NULL);
    return refCount;
}